

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PPointer::WriteValue(PPointer *this,FSerializer *ar,char *key,void *addr)

{
  bool bVar1;
  
  bVar1 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass);
  if (bVar1) {
    FSerializer::operator()(ar,key,(DObject **)addr);
    return;
  }
  __assert_fail("0 && \"Pointer points to a type we don\'t handle\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x67d,
                "virtual void PPointer::WriteValue(FSerializer &, const char *, const void *) const"
               );
}

Assistant:

void PPointer::WriteValue(FSerializer &ar, const char *key,const void *addr) const
{
	if (PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		ar(key, *(DObject **)addr);
	}
	else
	{
		assert(0 && "Pointer points to a type we don't handle");
		I_Error("Attempt to save pointer to unhandled type");
	}
}